

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O1

bool __thiscall ThreadRegion::removeSuccessor(ThreadRegion *this,ThreadRegion *successor)

{
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *this_00;
  size_t sVar1;
  ThreadRegion *pTVar2;
  bool bVar3;
  pair<std::_Rb_tree_iterator<ThreadRegion_*>,_std::_Rb_tree_iterator<ThreadRegion_*>_> pVar4;
  ThreadRegion *local_28;
  ThreadRegion *local_20;
  
  if (successor == (ThreadRegion *)0x0) {
    bVar3 = false;
  }
  else {
    local_28 = successor;
    pVar4 = std::
            _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
            ::equal_range(&(this->successors_)._M_t,&local_28);
    std::
    _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
    ::_M_erase_aux(&(this->successors_)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    pTVar2 = local_28;
    this_00 = &local_28->predecessors_;
    local_20 = this;
    pVar4 = std::
            _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
            ::equal_range(&this_00->_M_t,&local_20);
    sVar1 = (pTVar2->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    bVar3 = sVar1 != (pTVar2->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return bVar3;
}

Assistant:

bool ThreadRegion::removeSuccessor(ThreadRegion *successor) {
    if (!successor) {
        return false;
    }
    successors_.erase(successor);
    return successor->predecessors_.erase(this);
}